

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClear
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  CppType CVar5;
  string *psVar6;
  ulong uVar7;
  size_type sVar8;
  reference ppFVar9;
  FileDescriptor *pFVar10;
  reference pvVar11;
  LogMessage *pLVar12;
  FieldGenerator *pFVar13;
  OneofDescriptor *this_00;
  int __c;
  int __c_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  uint i_00;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  char *pcVar14;
  bool local_391;
  int local_354;
  int local_33c;
  int local_2e8;
  int i_1;
  bool have_enclosing_if;
  bool should_check_bit;
  FieldGenerator *generator_2;
  string fieldname;
  FieldDescriptor *field_3;
  undefined1 local_2a8 [4];
  int j;
  string last_field_name;
  string first_field_name;
  FieldGenerator *generator_1;
  string local_240;
  LogFinisher local_21a;
  byte local_219;
  LogMessage local_218;
  LogFinisher local_1da;
  byte local_1d9;
  LogMessage local_1d8;
  bool local_199;
  int local_198;
  LogFinisher local_192;
  bool have_outer_if;
  int count;
  LogFinisher local_152;
  byte local_151;
  LogMessage local_150;
  LogFinisher local_112;
  byte local_111;
  LogMessage local_110;
  int local_d8;
  int local_d4;
  int chunk_1;
  int index_1;
  FieldDescriptor *field_2;
  int chunk;
  int index;
  FieldDescriptor *field_1;
  int memset_run_end;
  int memset_run_start;
  uint32 last_chunk_mask;
  int last_chunk_end;
  int last_chunk_start;
  int last_chunk;
  FieldGenerator *local_80;
  FieldGenerator *generator;
  FieldDescriptor *field;
  byte local_59;
  LogMessage local_58;
  uint32 local_20;
  uint32 local_1c;
  int i;
  int last_i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  _i = printer;
  printer_local = (Printer *)this;
  psVar6 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
  io::Printer::Print(printer,
                     "void $classname$::Clear() {\n// @@protoc_insertion_point(message_clear_start:$full_name$)\n"
                     ,"classname",&this->classname_,"full_name",psVar6);
  io::Printer::Indent(_i);
  iVar4 = Descriptor::extension_range_count(this->descriptor_);
  if (0 < iVar4) {
    io::Printer::Print(_i,"_extensions_.Clear();\n");
  }
  local_1c = 0xffffffff;
  local_20 = 0;
LAB_003f1895:
  uVar7 = (ulong)(int)local_20;
  sVar8 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::size(&this->optimized_order_);
  if (sVar8 <= uVar7) {
    for (local_2e8 = 0; iVar4 = Descriptor::oneof_decl_count(this->descriptor_), pPVar2 = _i,
        local_2e8 < iVar4; local_2e8 = local_2e8 + 1) {
      this_00 = Descriptor::oneof_decl(this->descriptor_,local_2e8);
      psVar6 = OneofDescriptor::name_abi_cxx11_(this_00);
      io::Printer::Print(pPVar2,"clear_$oneof_name$();\n","oneof_name",psVar6);
    }
    if (this->num_weak_fields_ != 0) {
      io::Printer::Print(_i,"_weak_field_map_.ClearAll();\n");
    }
    pFVar10 = Descriptor::file(this->descriptor_);
    bVar3 = HasFieldPresence(pFVar10);
    if (bVar3) {
      io::Printer::Print(_i,"_has_bits_.Clear();\n");
    }
    bVar3 = PreserveUnknownFields(this->descriptor_);
    if (bVar3) {
      io::Printer::Print(_i,"_internal_metadata_.Clear();\n");
    }
    io::Printer::Outdent(_i);
    io::Printer::Print(_i,"}\n");
    return;
  }
  local_59 = 0;
  if (local_20 == local_1c) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0xa49);
    local_59 = 1;
    pLVar12 = internal::LogMessage::operator<<(&local_58,"CHECK failed: (i) != (last_i): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&field + 3),pLVar12);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  local_1c = local_20;
  for (; uVar7 = (ulong)(int)local_20,
      sVar8 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(&this->optimized_order_), uVar7 < sVar8; local_20 = local_20 + 1) {
    ppFVar9 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](&this->optimized_order_,(long)(int)local_20);
    generator = (FieldGenerator *)*ppFVar9;
    local_80 = FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)generator);
    bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)generator);
    if (!bVar3) break;
    if (((this->use_dependent_base_ & 1U) == 0) ||
       (bVar3 = IsFieldDependent((FieldDescriptor *)generator), pPVar2 = _i, !bVar3)) {
      (*local_80->_vptr_FieldGenerator[10])(local_80,_i);
    }
    else {
      FieldName_abi_cxx11_((string *)&last_chunk_start,(cpp *)generator,field_00);
      io::Printer::Print(pPVar2,"clear_$name$();\n","name",(string *)&last_chunk_start);
      std::__cxx11::string::~string((string *)&last_chunk_start);
    }
  }
  last_chunk_end = -1;
  last_chunk_mask = 0xffffffff;
  memset_run_start = -1;
  memset_run_end = 0;
  field_1._4_4_ = 0xffffffff;
  for (; uVar7 = (ulong)(int)local_20, field_1._0_4_ = memset_run_start,
      sVar8 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(&this->optimized_order_), uVar7 < sVar8; local_20 = local_20 + 1) {
    pcVar14 = (char *)(long)(int)local_20;
    ppFVar9 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](&this->optimized_order_,(size_type)pcVar14);
    _chunk = *ppFVar9;
    bVar3 = anon_unknown_0::CanInitializeByZeroing(_chunk);
    if (!bVar3) break;
    pFVar10 = Descriptor::file(this->descriptor_);
    bVar3 = HasFieldPresence(pFVar10);
    if (bVar3) {
      pcVar14 = FieldDescriptor::index(_chunk,pcVar14,__c);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&this->has_bit_indices_,(long)(int)pcVar14);
      local_33c = *pvVar11;
    }
    else {
      local_33c = 0;
    }
    field_2._4_4_ = local_33c;
    field_2._0_4_ = local_33c / 8;
    if (last_chunk_end == -1) {
      last_chunk_mask = local_20;
      last_chunk_end = (int)field_2;
    }
    else if ((int)field_2 != last_chunk_end) break;
    if (field_1._4_4_ == 0xffffffff) {
      field_1._4_4_ = local_20;
    }
    memset_run_start = local_20;
    memset_run_end = 1 << ((byte)((long)local_33c % 0x20) & 0x1f) | memset_run_end;
  }
  do {
    uVar7 = (ulong)(int)local_20;
    sVar8 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(&this->optimized_order_);
    if (sVar8 <= uVar7) break;
    pcVar14 = (char *)(long)(int)local_20;
    ppFVar9 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](&this->optimized_order_,(size_type)pcVar14);
    _chunk_1 = *ppFVar9;
    bVar3 = FieldDescriptor::is_repeated(_chunk_1);
    if ((bVar3) || (bVar3 = anon_unknown_0::CanInitializeByZeroing(_chunk_1), bVar3)) break;
    pFVar10 = Descriptor::file(this->descriptor_);
    bVar3 = HasFieldPresence(pFVar10);
    if (bVar3) {
      pcVar14 = FieldDescriptor::index(_chunk_1,pcVar14,__c_00);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&this->has_bit_indices_,(long)(int)pcVar14);
      local_354 = *pvVar11;
    }
    else {
      local_354 = 0;
    }
    local_d4 = local_354;
    local_d8 = local_354 / 8;
    if (last_chunk_end == -1) {
      last_chunk_mask = local_20;
      last_chunk_end = local_d8;
    }
    else if (local_d8 != last_chunk_end) break;
    memset_run_start = local_20;
    memset_run_end = 1 << ((byte)((long)local_354 % 0x20) & 0x1f) | memset_run_end;
    local_20 = local_20 + 1;
  } while( true );
  if (last_chunk_end != -1) {
    local_111 = 0;
    if (last_chunk_mask == 0xffffffff) {
      internal::LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xa9e);
      local_111 = 1;
      pLVar12 = internal::LogMessage::operator<<
                          (&local_110,"CHECK failed: (-1) != (last_chunk_start): ");
      internal::LogFinisher::operator=(&local_112,pLVar12);
    }
    if ((local_111 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_110);
    }
    local_151 = 0;
    if (memset_run_start == -1) {
      internal::LogMessage::LogMessage
                (&local_150,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xa9f);
      local_151 = 1;
      pLVar12 = internal::LogMessage::operator<<
                          (&local_150,"CHECK failed: (-1) != (last_chunk_end): ");
      internal::LogFinisher::operator=(&local_152,pLVar12);
    }
    if ((local_151 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_150);
    }
    have_outer_if = false;
    if (memset_run_end == 0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&count,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xaa0);
      have_outer_if = true;
      pLVar12 = internal::LogMessage::operator<<
                          ((LogMessage *)&count,"CHECK failed: (0) != (last_chunk_mask): ");
      internal::LogFinisher::operator=(&local_192,pLVar12);
    }
    if ((have_outer_if & 1U) != 0) {
      internal::LogMessage::~LogMessage((LogMessage *)&count);
    }
    local_198 = popcnt(memset_run_end);
    pFVar10 = Descriptor::file(this->descriptor_);
    bVar3 = HasFieldPresence(pFVar10);
    local_391 = bVar3 && last_chunk_mask != memset_run_start;
    local_199 = local_391;
    if (bVar3 && last_chunk_mask != memset_run_start) {
      local_1d9 = 0;
      iVar4 = extraout_EDX;
      if (local_198 < 2) {
        internal::LogMessage::LogMessage
                  (&local_1d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xaaa);
        local_1d9 = 1;
        pLVar12 = internal::LogMessage::operator<<(&local_1d8,"CHECK failed: (2) <= (count): ");
        internal::LogFinisher::operator=(&local_1da,pLVar12);
        iVar4 = extraout_EDX_00;
      }
      if ((local_1d9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_1d8);
        iVar4 = extraout_EDX_01;
      }
      local_219 = 0;
      if (8 < local_198) {
        internal::LogMessage::LogMessage
                  (&local_218,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xaab);
        local_219 = 1;
        pLVar12 = internal::LogMessage::operator<<(&local_218,"CHECK failed: (8) >= (count): ");
        internal::LogFinisher::operator=(&local_21a,pLVar12);
        iVar4 = extraout_EDX_02;
      }
      if ((local_219 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_218);
        iVar4 = extraout_EDX_03;
      }
      pPVar2 = _i;
      SimpleItoa_abi_cxx11_(&local_240,(protobuf *)(ulong)(uint)(last_chunk_end << 3),iVar4);
      SimpleItoa_abi_cxx11_((string *)&generator_1,(protobuf *)(ulong)(uint)memset_run_end,i_00);
      io::Printer::Print(pPVar2,"if (_has_bits_[$index$ / 32] & $mask$u) {\n","index",&local_240,
                         "mask",(string *)&generator_1);
      std::__cxx11::string::~string((string *)&generator_1);
      std::__cxx11::string::~string((string *)&local_240);
      io::Printer::Indent(_i);
    }
    if (field_1._4_4_ != 0xffffffff) {
      if (field_1._4_4_ == (uint32)field_1) {
        ppFVar9 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](&this->optimized_order_,(long)(int)field_1._4_4_);
        pFVar13 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar9);
        (*pFVar13->_vptr_FieldGenerator[10])(pFVar13,_i);
      }
      else {
        ppFVar9 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](&this->optimized_order_,(long)(int)field_1._4_4_);
        FieldName_abi_cxx11_
                  ((string *)((long)&last_field_name.field_2 + 8),(cpp *)*ppFVar9,field_01);
        ppFVar9 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](&this->optimized_order_,(long)(int)(uint32)field_1);
        FieldName_abi_cxx11_((string *)local_2a8,(cpp *)*ppFVar9,field_02);
        io::Printer::Print(_i,
                           "::memset(&$first$_, 0, reinterpret_cast<char*>(&$last$_) -\n  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n"
                           ,"first",(string *)((long)&last_field_name.field_2 + 8),"last",
                           (string *)local_2a8);
        std::__cxx11::string::~string((string *)local_2a8);
        std::__cxx11::string::~string((string *)(last_field_name.field_2._M_local_buf + 8));
      }
      last_chunk_mask = (uint32)field_1 + 1;
    }
    for (field_3._4_4_ = last_chunk_mask; (int)field_3._4_4_ <= memset_run_start;
        field_3._4_4_ = field_3._4_4_ + 1) {
      ppFVar9 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](&this->optimized_order_,(long)(int)field_3._4_4_);
      fieldname.field_2._8_8_ = *ppFVar9;
      FieldName_abi_cxx11_((string *)&generator_2,(cpp *)fieldname.field_2._8_8_,field_03);
      pFVar13 = FieldGeneratorMap::get
                          (&this->field_generators_,(FieldDescriptor *)fieldname.field_2._8_8_);
      CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)fieldname.field_2._8_8_);
      bVar3 = true;
      if (CVar5 != CPPTYPE_MESSAGE) {
        CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)fieldname.field_2._8_8_);
        bVar3 = CVar5 == CPPTYPE_STRING;
      }
      bVar1 = false;
      if (bVar3) {
        pFVar10 = Descriptor::file(this->descriptor_);
        bVar3 = HasFieldPresence(pFVar10);
        if (bVar3) {
          io::Printer::Print(_i,"if (has_$name$()) {\n","name",(string *)&generator_2);
          io::Printer::Indent(_i);
          bVar1 = true;
        }
      }
      (*pFVar13->_vptr_FieldGenerator[10])(pFVar13,_i);
      if (bVar1) {
        io::Printer::Outdent(_i);
        io::Printer::Print(_i,"}\n");
      }
      std::__cxx11::string::~string((string *)&generator_2);
    }
    if ((local_199 & 1U) != 0) {
      io::Printer::Outdent(_i);
      io::Printer::Print(_i,"}\n");
    }
  }
  goto LAB_003f1895;
}

Assistant:

void MessageGenerator::
GenerateClear(io::Printer* printer) {
  printer->Print(
      "void $classname$::Clear() {\n"
      "// @@protoc_insertion_point(message_clear_start:$full_name$)\n",
      "classname", classname_, "full_name", descriptor_->full_name());
  printer->Indent();

  // Step 1: Extensions
  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.Clear();\n");
  }

  int last_i = -1;
  for (int i = 0; i < optimized_order_.size(); ) {
    // Detect infinite loops.
    GOOGLE_CHECK_NE(i, last_i);
    last_i = i;

    // Step 2: Repeated fields don't use _has_bits_; emit code to clear them
    // here.
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      const FieldGenerator& generator = field_generators_.get(field);

      if (!field->is_repeated()) {
        break;
      }

      if (use_dependent_base_ && IsFieldDependent(field)) {
        printer->Print("clear_$name$();\n", "name", FieldName(field));
      } else {
        generator.GenerateMessageClearingCode(printer);
      }
    }

    // Step 3: Greedily seek runs of fields that can be cleared by
    // memset-to-0.
    int last_chunk = -1;
    int last_chunk_start = -1;
    int last_chunk_end = -1;
    uint32 last_chunk_mask = 0;

    int memset_run_start = -1;
    int memset_run_end = -1;
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];

      if (!CanInitializeByZeroing(field)) {
        break;
      }

      // "index" defines where in the _has_bits_ the field appears.
      // "i" is our loop counter within optimized_order_.
      int index = HasFieldPresence(descriptor_->file()) ?
          has_bit_indices_[field->index()] : 0;
      int chunk = index / 8;

      if (last_chunk == -1) {
        last_chunk = chunk;
        last_chunk_start = i;
      } else if (chunk != last_chunk) {
        // Emit the fields for this chunk so far.
        break;
      }

      if (memset_run_start == -1) {
        memset_run_start = i;
      }

      memset_run_end = i;
      last_chunk_end = i;
      last_chunk_mask |= static_cast<uint32>(1) << (index % 32);
    }

    // Step 4: Non-repeated, non-zero initializable fields.
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (field->is_repeated() || CanInitializeByZeroing(field)) {
        break;
      }

      // "index" defines where in the _has_bits_ the field appears.
      // "i" is our loop counter within optimized_order_.
      int index = HasFieldPresence(descriptor_->file()) ?
          has_bit_indices_[field->index()] : 0;
      int chunk = index / 8;

      if (last_chunk == -1) {
        last_chunk = chunk;
        last_chunk_start = i;
      } else if (chunk != last_chunk) {
        // Emit the fields for this chunk so far.
        break;
      }

      last_chunk_end = i;
      last_chunk_mask |= static_cast<uint32>(1) << (index % 32);
    }

    if (last_chunk != -1) {
      GOOGLE_DCHECK_NE(-1, last_chunk_start);
      GOOGLE_DCHECK_NE(-1, last_chunk_end);
      GOOGLE_DCHECK_NE(0, last_chunk_mask);

      const int count = popcnt(last_chunk_mask);
      const bool have_outer_if = HasFieldPresence(descriptor_->file()) &&
          (last_chunk_start != last_chunk_end);

      if (have_outer_if) {
        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        GOOGLE_DCHECK_LE(2, count);
        GOOGLE_DCHECK_GE(8, count);

        printer->Print(
          "if (_has_bits_[$index$ / 32] & $mask$u) {\n",
          "index", SimpleItoa(last_chunk * 8),
          "mask", SimpleItoa(last_chunk_mask));
        printer->Indent();
      }

      if (memset_run_start != -1) {
        if (memset_run_start == memset_run_end) {
          // For clarity, do not memset a single field.
          const FieldGenerator& generator =
              field_generators_.get(optimized_order_[memset_run_start]);
          generator.GenerateMessageClearingCode(printer);
        } else {
          const string first_field_name =
              FieldName(optimized_order_[memset_run_start]);
          const string last_field_name =
              FieldName(optimized_order_[memset_run_end]);

          printer->Print(
            "::memset(&$first$_, 0, reinterpret_cast<char*>(&$last$_) -\n"
            "  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n",
            "first", first_field_name,
            "last", last_field_name);
        }

        // Advance last_chunk_start to skip over the fields we zeroed/memset.
        last_chunk_start = memset_run_end + 1;
      }

      // Go back and emit clears for each of the fields we processed.
      for (int j = last_chunk_start; j <= last_chunk_end; j++) {
        const FieldDescriptor* field = optimized_order_[j];
        const string fieldname = FieldName(field);
        const FieldGenerator& generator = field_generators_.get(field);

        // It's faster to just overwrite primitive types, but we should only
        // clear strings and messages if they were set.
        //
        // TODO(kenton):  Let the CppFieldGenerator decide this somehow.
        bool should_check_bit =
          field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
          field->cpp_type() == FieldDescriptor::CPPTYPE_STRING;

        bool have_enclosing_if = false;
        if (should_check_bit &&
            // If no field presence, then always clear strings/messages as well.
            HasFieldPresence(descriptor_->file())) {
          printer->Print("if (has_$name$()) {\n", "name", fieldname);
          printer->Indent();
          have_enclosing_if = true;
        }

        generator.GenerateMessageClearingCode(printer);

        if (have_enclosing_if) {
          printer->Outdent();
          printer->Print("}\n");
        }
      }

      if (have_outer_if) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Step 4: Unions.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
        "clear_$oneof_name$();\n",
        "oneof_name", descriptor_->oneof_decl(i)->name());
  }

  if (num_weak_fields_) {
    printer->Print("_weak_field_map_.ClearAll();\n");
  }

  if (HasFieldPresence(descriptor_->file())) {
    // Step 5: Everything else.
    printer->Print("_has_bits_.Clear();\n");
  }

  if (PreserveUnknownFields(descriptor_)) {
    printer->Print("_internal_metadata_.Clear();\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}